

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::load(info *this,istream *is,entry_types entries,codepage_id force_codepage)

{
  bool bVar1;
  TypesafeBoolean p_Var2;
  runtime_error *this_00;
  exception *this_01;
  version *in_RDI;
  version_constant next_version;
  warning_suppressor warnings;
  streampos start;
  bool parsed_without_errors;
  bool ambiguous;
  version_constant listed_version;
  ostringstream oss;
  undefined4 in_stack_fffffffffffffa68;
  log_level in_stack_fffffffffffffa6c;
  undefined4 in_stack_fffffffffffffa70;
  enum_type in_stack_fffffffffffffa74;
  flags<setup::info::entry_types_Enum_,_21UL> *in_stack_fffffffffffffa78;
  enum_type flag;
  undefined6 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa86;
  undefined1 in_stack_fffffffffffffa87;
  undefined1 uVar3;
  version *in_stack_fffffffffffffa88;
  ostream *in_stack_fffffffffffffa90;
  warning_suppressor *in_stack_fffffffffffffaa0;
  logger *in_stack_fffffffffffffba0;
  istream *in_stack_fffffffffffffca8;
  version *in_stack_fffffffffffffcb0;
  codepage_id in_stack_fffffffffffffd0c;
  istream *in_stack_fffffffffffffd10;
  info *in_stack_fffffffffffffd18;
  _Base_bitset<1UL> in_stack_fffffffffffffd20;
  string local_1d0 [48];
  ostringstream local_1a0 [376];
  Type local_28;
  
  setup::version::load(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  if ((in_RDI->known & 1U) == 0) {
    local_28.super__Base_bitset<1UL>._M_w =
         (_Base_bitset<1UL>)
         flags<setup::info::entry_types_Enum_,_21UL>::operator&
                   (in_stack_fffffffffffffa78,in_stack_fffffffffffffa74);
    p_Var2 = ::flags::operator_cast_to_function_pointer
                       ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x178b96);
    if (p_Var2 != (TypesafeBoolean)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      std::operator<<((ostream *)local_1a0,"Unexpected setup data version: ");
      setup::operator<<(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_00,local_1d0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    logger::logger((logger *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                   in_stack_fffffffffffffa6c);
    in_stack_fffffffffffffaa0 =
         (warning_suppressor *)
         logger::operator<<((logger *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                            (char (*) [10])
                            CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    logger::operator<<((logger *)
                       CONCAT17(in_stack_fffffffffffffa87,
                                CONCAT16(in_stack_fffffffffffffa86,in_stack_fffffffffffffa80)),
                       (shell_command *)in_stack_fffffffffffffa78);
    logger::operator<<((logger *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
                       (version *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    logger::operator<<((logger *)
                       CONCAT17(in_stack_fffffffffffffa87,
                                CONCAT16(in_stack_fffffffffffffa86,in_stack_fffffffffffffa80)),
                       (shell_command *)in_stack_fffffffffffffa78);
    logger::~logger(in_stack_fffffffffffffba0);
  }
  flag = (enum_type)((ulong)in_stack_fffffffffffffa78 >> 0x20);
  uVar3 = true;
  if ((in_RDI->known & 1U) != 0) {
    uVar3 = setup::version::is_ambiguous(in_RDI);
  }
  bVar1 = setup::version::is_ambiguous(in_RDI);
  if (bVar1) {
    flags<setup::info::entry_types_Enum_,_21UL>::operator|=
              ((flags<setup::info::entry_types_Enum_,_21UL> *)
               CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffa86,in_stack_fffffffffffffa80)),flag);
  }
  std::istream::tellg();
  warning_suppressor::warning_suppressor(in_stack_fffffffffffffaa0);
  try_load(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
           (entry_types)in_stack_fffffffffffffd20._M_w,in_stack_fffffffffffffd0c);
  bVar1 = warning_suppressor::operator_cast_to_bool
                    ((warning_suppressor *)
                     CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffa86,in_stack_fffffffffffffa80)));
  if (bVar1) {
    this_01 = (exception *)__cxa_allocate_exception(8);
    std::exception::exception(this_01);
    __cxa_throw(this_01,&std::exception::typeinfo,std::exception::~exception);
  }
  warning_suppressor::flush(in_stack_fffffffffffffaa0);
  warning_suppressor::~warning_suppressor
            ((warning_suppressor *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
  return;
}

Assistant:

void info::load(std::istream & is, entry_types entries, util::codepage_id force_codepage) {
	
	version.load(is);
	
	if(!version.known) {
		if(entries & NoUnknownVersion) {
			std::ostringstream oss;
			oss << "Unexpected setup data version: " << version;
			throw std::runtime_error(oss.str());
		}
		log_warning << "Unexpected setup data version: "
		            << color::white << version << color::reset;
	}
	
	version_constant listed_version = version.value;
	
	// Some setup versions didn't increment the data version number when they should have.
	// To work around this, we try to parse the headers for all data versions and use the first
	// version that parses without warnings or errors.
	bool ambiguous = !version.known || version.is_ambiguous();
	if(version.is_ambiguous()) {
		// Force parsing all headers so that we don't miss any errors.
		entries |= NoSkip;
	}
	
	bool parsed_without_errors = false;
	std::streampos start = is.tellg();
	for(;;) {
		
		warning_suppressor warnings;
		
		try {
			
			// Try to parse headers for this version
			try_load(is, entries, force_codepage);
			
			if(warnings) {
				// Parsed without errors but with warnings - try other versions first
				if(!parsed_without_errors) {
					listed_version = version.value;
					parsed_without_errors = true;
				}
				throw std::exception();
			}
			
			warnings.flush();
			return;
			
		} catch(...) {
			
			is.clear();
			is.seekg(start);
			
			version_constant next_version = version.next();
			
			if(!ambiguous || !next_version) {
				if(version.value != listed_version) {
					// Rewind to a previous version that had better results and report those
					version.value = listed_version;
					warnings.restore();
					try_load(is, entries, force_codepage);
				} else {
					// Otherwise. report results for the current version
					warnings.flush();
					if(!parsed_without_errors) {
						throw;
					}
				}
				return;
			}
			
			// Retry with the next version
			version.value = next_version;
			ambiguous = version.is_ambiguous();
			
		}
		
	}
	
}